

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knetfile.c
# Opt level: O1

ssize_t knet_read(knetFile *fp,void *buf,size_t len)

{
  ssize_t sVar1;
  int *piVar2;
  off_t oVar3;
  size_t rest;
  
  if (fp->fd == -1) {
    oVar3 = 0;
  }
  else {
    if (fp->type == 3) {
      if (fp->is_ready == 0) {
        khttp_connect_file(fp);
      }
    }
    else if ((fp->type == 2) && (fp->is_ready == 0)) {
      if (fp->no_reconnect == 0) {
        kftp_reconnect(fp);
      }
      kftp_connect_file(fp);
    }
    if (fp->type == 1) {
      oVar3 = 0;
      if (len != 0) {
        do {
          while( true ) {
            sVar1 = read(fp->fd,(void *)((long)buf + oVar3),len);
            if (-1 < sVar1) break;
            piVar2 = __errno_location();
            if (*piVar2 != 4) {
              return -1;
            }
          }
          if (sVar1 == 0) break;
          oVar3 = oVar3 + sVar1;
          len = len - sVar1;
        } while (len != 0);
      }
    }
    else {
      oVar3 = my_netread(fp->fd,buf,len);
    }
    fp->offset = fp->offset + oVar3;
  }
  return oVar3;
}

Assistant:

ssize_t knet_read(knetFile *fp, void *buf, size_t len)
{
	off_t l = 0;
	if (fp->fd == -1) return 0;
	if (fp->type == KNF_TYPE_FTP) {
		if (fp->is_ready == 0) {
			if (!fp->no_reconnect) kftp_reconnect(fp);
			kftp_connect_file(fp);
		}
	} else if (fp->type == KNF_TYPE_HTTP) {
		if (fp->is_ready == 0)
			khttp_connect_file(fp);
	}
	if (fp->type == KNF_TYPE_LOCAL) { // on Windows, the following block is necessary; not on UNIX
		size_t rest = len;
		ssize_t curr;
		while (rest) {
			do {
				curr = read(fp->fd, (void*)((char*)buf + l), rest);
			} while (curr < 0 && EINTR == errno);
			if (curr < 0) return -1;
			if (curr == 0) break;
			l += curr; rest -= curr;
		}
	} else l = my_netread(fp->fd, buf, len);
	fp->offset += l;
	return l;
}